

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O2

int cmdParseScript(char *script,cmdScript_t *s,int diags)

{
  cmdTagStep_t *pcVar1;
  cmdInstr_t *pcVar2;
  int iVar3;
  uintptr_t uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  char *__format;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  cmdCtlParse_t ctl;
  uintptr_t p [10];
  cmdTagStep_t tag_step [50];
  char v [65536];
  
  ctl.eaten = 0;
  sVar7 = strlen(script);
  iVar3 = (int)sVar7;
  piVar8 = (int *)calloc(1,(long)((int)((ulong)((long)(iVar3 + 2) * 0x30) >> 1) + iVar3 + 0x280));
  s->par = piVar8;
  if (piVar8 == (int *)0x0) {
    iVar10 = -1;
  }
  else {
    s->var = piVar8 + 10;
    s->instr = (cmdInstr_t *)(piVar8 + 0xa0);
    s->str_area = (char *)(piVar8 + (long)((iVar3 + 2) / 2) * 0xc + 0xa0);
    s->str_area_len = iVar3;
    s->str_area_pos = 0;
    s->instrs = 0;
    uVar13 = 0;
    iVar10 = 0;
    iVar5 = 0;
    while (iVar5 < iVar3) {
      iVar6 = cmdParse(script,p,0x10000,v,&ctl);
      uVar4 = p[3];
      iVar5 = -1;
      if (((iVar6 == -1) || (iVar5 = -4, cmdInfo[intCmdIdx].cvis == 0)) ||
         (iVar5 = iVar6, iVar6 < 0)) {
        if (diags != 0) {
          __format = "Bad parameter to %s\n";
          if (iVar5 == -4) {
            __format = "Command illegal in script: %s\n";
          }
          if (iVar5 == -1) {
            __format = "Unknown command: %s\n";
          }
          fprintf(_stderr,__format,intCmdStr);
        }
        iVar5 = ctl.eaten;
        if (iVar10 == 0) {
          iVar10 = -0x37;
        }
      }
      else {
        if (p[3] != 0) {
          memcpy(s->str_area + s->str_area_pos,v,p[3]);
          s->str_area[(long)s->str_area_pos + uVar4] = '\0';
          p[4] = (uintptr_t)(s->str_area + s->str_area_pos);
          s->str_area_pos = s->str_area_pos + (int)uVar4 + 1;
        }
        uVar4 = p[1];
        if (p[0] == 0x331) {
          if ((int)uVar13 < 0x32) {
            uVar11 = 0;
            if (0 < (int)uVar13) {
              uVar11 = (ulong)uVar13;
            }
            for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
              if (uVar4 == tag_step[uVar9].tag) {
                if (diags != 0) {
                  fprintf(_stderr,"Duplicate tag: %ld\n",uVar4);
                }
                if (iVar10 == 0) {
                  iVar10 = -0x35;
                }
              }
            }
            tag_step[(int)uVar13].tag = (uint32_t)uVar4;
            tag_step[(int)uVar13].step = s->instrs;
            uVar13 = uVar13 + 1;
            iVar5 = ctl.eaten;
          }
          else {
            if (diags != 0) {
              fprintf(_stderr,"Too many tags: %ld\n",p[1]);
            }
            iVar5 = ctl.eaten;
            if (iVar10 == 0) {
              iVar10 = -0x36;
            }
          }
        }
        else {
          pcVar2 = s->instr;
          iVar5 = s->instrs;
          s->instrs = iVar5 + 1;
          pcVar2[iVar5].p[0] = p[0];
          pcVar2[iVar5].p[1] = p[1];
          pcVar2[iVar5].p[2] = p[2];
          (pcVar2[iVar5].p + 2)[1] = p[3];
          pcVar2[iVar5].p[4] = p[4];
          *&pcVar2[iVar5].opt = ctl.opt;
          iVar5 = ctl.eaten;
        }
      }
    }
    if ((int)uVar13 < 1) {
      uVar13 = 0;
    }
    for (lVar12 = 0; lVar12 < s->instrs; lVar12 = lVar12 + 1) {
      pcVar2 = s->instr;
      uVar11 = pcVar2[lVar12].p[0] - 0x322;
      if ((uVar11 < 0xf) && ((0x7c01U >> ((uint)uVar11 & 0x1f) & 1) != 0)) {
        uVar11 = 0;
        do {
          if (uVar13 == uVar11) {
            if (diags != 0) {
              fprintf(_stderr,"Can\'t resolve tag %ld\n");
            }
            if (iVar10 == 0) {
              iVar10 = -0x3f;
            }
            goto LAB_0010474f;
          }
          pcVar1 = tag_step + uVar11;
          uVar11 = uVar11 + 1;
        } while (pcVar2[lVar12].p[1] != (ulong)pcVar1->tag);
        pcVar2[lVar12].p[1] = (long)*(int *)((long)p + uVar11 * 8 + 0x4c);
      }
LAB_0010474f:
    }
  }
  return iVar10;
}

Assistant:

int cmdParseScript(char *script, cmdScript_t *s, int diags)
{
   int idx, len, b, i, j, tags, resolved;
   int status;
   uintptr_t p[10];
   cmdInstr_t instr;
   cmdCtlParse_t ctl;
   char v[CMD_MAX_EXTENSION];

   ctl.eaten = 0;

   status = 0;

   cmdTagStep_t tag_step[PI_MAX_SCRIPT_TAGS];

   len = strlen(script);

   /* calloc space for PARAMS, VARS, CMDS, and STRINGS */

   b = (sizeof(int) * (PI_MAX_SCRIPT_PARAMS + PI_MAX_SCRIPT_VARS)) +
       (sizeof(cmdInstr_t) * (len + 2) / 2) + len;

   s->par = calloc(1, b);

   if (s->par == NULL) return -1;

   s->var = s->par + PI_MAX_SCRIPT_PARAMS;

   s->instr = (cmdInstr_t *)(s->var + PI_MAX_SCRIPT_VARS);

   s->str_area = (char *)(s->instr + ((len + 2) / 2));

   s->str_area_len = len;
   s->str_area_pos = 0;

   s->instrs = 0;

   tags = 0;

   idx = 0;

   while (ctl.eaten<len)
   {
      idx = cmdParse(script, p, CMD_MAX_EXTENSION, v, &ctl);

      /* abort if command is illegal in a script */

      if ((idx >= 0) || (idx != CMD_UNKNOWN_CMD))
      {
         if (!cmdInfo[intCmdIdx].cvis) idx = CMD_NOT_IN_SCRIPT;
      }

      if (idx >= 0)
      {
         if (p[3])
         {
            memcpy(s->str_area + s->str_area_pos, v, p[3]);
            s->str_area[s->str_area_pos + p[3]] = 0;
            p[4] = (intptr_t) s->str_area + s->str_area_pos;
            s->str_area_pos += (p[3] + 1);
         }

         memcpy(&instr.p, p, sizeof(instr.p));

         if (instr.p[0] == PI_CMD_TAG)
         {
            if (tags < PI_MAX_SCRIPT_TAGS)
            {
               /* check tag not already used */
               for (j=0; j<tags; j++)
               {
                  if (tag_step[j].tag == instr.p[1])
                  {
                     if (diags)
                     {
                        fprintf(stderr, "Duplicate tag: %"PRIdPTR"\n", instr.p[1]);
                     }

                     if (!status) status = PI_DUP_TAG;
                     idx = -1;
                  }
               }

               tag_step[tags].tag = instr.p[1];
               tag_step[tags].step = s->instrs;
               tags++;
            }
            else
            {
               if (diags)
               {
                  fprintf(stderr, "Too many tags: %"PRIdPTR"\n", instr.p[1]);
               }
               if (!status) status = PI_TOO_MANY_TAGS;
               idx = -1;
            }
         }
      }
      else
      {
         if (diags)
         {
            if (idx == CMD_UNKNOWN_CMD)
               fprintf(stderr, "Unknown command: %s\n", cmdStr());
            else if (idx == CMD_NOT_IN_SCRIPT)
               fprintf(stderr, "Command illegal in script: %s\n", cmdStr());
            else
               fprintf(stderr, "Bad parameter to %s\n", cmdStr());
         }
         if (!status) status = PI_BAD_SCRIPT_CMD;
      }

      if (idx >= 0)
      {
         if (instr.p[0] != PI_CMD_TAG)
         {
            memcpy(instr.opt, &ctl.opt, sizeof(instr.opt));
            s->instr[s->instrs++] = instr;
         }
      }
   }

   for (i=0; i<s->instrs; i++)
   {
      instr = s->instr[i];

      /* resolve jumps */

      if ((instr.p[0] == PI_CMD_JMP) || (instr.p[0] == PI_CMD_CALL) ||
          (instr.p[0] == PI_CMD_JZ)  || (instr.p[0] == PI_CMD_JNZ)  ||
          (instr.p[0] == PI_CMD_JM)  || (instr.p[0] == PI_CMD_JP))
      {
         resolved = 0;

         for (j=0; j<tags; j++)
         {
            if (instr.p[1] == tag_step[j].tag)
            {
               s->instr[i].p[1] = tag_step[j].step;
               resolved = 1;
               break;
            }
         }

         if (!resolved)
         {
            if (diags)
            {
               fprintf(stderr, "Can't resolve tag %"PRIdPTR"\n", instr.p[1]);
            }
            if (!status) status = PI_BAD_TAG;
         }
      }
   }
   return status;
}